

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpServer.cpp
# Opt level: O1

void __thiscall asl::HttpServer::serve(HttpServer *this,Socket *client)

{
  Dic<asl::String> *this_00;
  WebSocketServer *pWVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  size_t in_RCX;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  HttpRequest *pHVar6;
  String *pSVar7;
  undefined8 __s1;
  anon_union_16_2_78e7fdac_for_String_2 *paVar8;
  undefined8 uVar9;
  double dVar10;
  String range;
  String mime;
  Array<asl::String> parts;
  File file;
  String hconn;
  HttpResponse response;
  HttpRequest request;
  String local_338;
  String local_320;
  String local_308;
  HttpServer *local_2f0;
  undefined1 local_2e8 [8];
  undefined1 local_2e0 [8];
  String local_2d8 [2];
  String local_298;
  String local_280;
  uint local_264;
  HttpResponse local_260;
  String *local_1d8;
  double local_1d0;
  String local_1c8;
  String local_1b0;
  String local_198;
  HttpRequest local_180;
  
  local_1d0 = now();
  iVar4 = (*((client->super_SmartObject)._p)->_vptr_SmartObject_[5])();
  if ((char)iVar4 == '\0') {
    local_1d8 = &this->_methods;
    this_00 = &this->_mimetypes;
    do {
      dVar10 = now();
      if (10.0 <= dVar10 - local_1d0) {
        return;
      }
      if ((this->super_SocketServer)._requestStop != false) {
        return;
      }
      iVar4 = (*((client->super_SmartObject)._p)->_vptr_SmartObject_[0xf])(0x4014000000000000);
      if (((char)iVar4 != '\0') &&
         (iVar4 = (*((client->super_SmartObject)._p)->_vptr_SmartObject_[5])(), (char)iVar4 == '\0')
         ) {
        HttpRequest::HttpRequest(&local_180,client);
        bVar3 = true;
        if (((client->super_SmartObject)._p[3].rc.n == 0) &&
           (((0 < local_180._method._len && (0 < local_180._path._len)) &&
            (0 < local_180.super_HttpMessage._proto._len)))) {
          String::String((String *)local_2e0,"Connection");
          HttpMessage::header((String *)&local_260,&local_180.super_HttpMessage,(String *)local_2e0)
          ;
          String::toLowerCase(&local_298,(String *)&local_260);
          if (local_260.super_HttpMessage._command._size != 0) {
            free(local_260.super_HttpMessage._command.field_2._str);
          }
          if (local_2e0._0_4_ != 0) {
            free((void *)local_2d8[0]._0_8_);
          }
          String::String((String *)local_2e0,"Upgrade");
          HttpMessage::header((String *)&local_260,&local_180.super_HttpMessage,(String *)local_2e0)
          ;
          uVar9 = local_260.super_HttpMessage._command.field_2._str;
          iVar4 = local_260.super_HttpMessage._command._size;
          __s1 = local_260.super_HttpMessage._command.field_2._str;
          if (local_260.super_HttpMessage._command._size == 0) {
            __s1 = &local_260.super_HttpMessage._command.field_2;
          }
          iVar5 = strcmp((char *)__s1,"websocket");
          if (iVar5 == 0) {
            pWVar1 = this->_wsserver;
            local_2f0 = this;
            if (iVar4 != 0) {
              free((void *)uVar9);
            }
            if (local_2e0._0_4_ != 0) {
              free((void *)local_2d8[0]._0_8_);
            }
            this = local_2f0;
            if (pWVar1 == (WebSocketServer *)0x0) goto LAB_00120073;
            if (verbose == '\x01') {
              puts("handing over to ws");
            }
            bVar3 = true;
            WebSocketServer::process(this->_wsserver,client,&local_180.super_HttpMessage._headers);
          }
          else {
            if (iVar4 != 0) {
              free((void *)uVar9);
            }
            if (local_2e0._0_4_ != 0) {
              free((void *)local_2d8[0]._0_8_);
            }
LAB_00120073:
            HttpResponse::HttpResponse(&local_260,&local_180);
            bVar3 = this->_cors;
            if (bVar3 == true) {
              String::String(&local_1c8,"Origin");
              bVar2 = HttpMessage::hasHeader(&local_180.super_HttpMessage,&local_1c8);
            }
            else {
              bVar2 = false;
            }
            if ((bVar3 != false) && (local_1c8._size != 0)) {
              free(local_1c8.field_2._str);
            }
            if (bVar2 != false) {
              String::String((String *)local_2e0,"Access-Control-Allow-Origin");
              String::String(&local_338,"Origin");
              HttpMessage::header(&local_308,&local_180.super_HttpMessage,&local_338);
              HttpMessage::setHeader(&local_260.super_HttpMessage,(String *)local_2e0,&local_308);
              if (local_308._size != 0) {
                free(local_308.field_2._str);
              }
              if (local_338._size != 0) {
                free(local_338.field_2._str);
              }
              if (local_2e0._0_4_ != 0) {
                free((void *)local_2d8[0]._0_8_);
              }
              String::String((String *)local_2e0,"Access-Control-Allow-Credentials");
              String::String(&local_308,"true");
              HttpMessage::setHeader(&local_260.super_HttpMessage,(String *)local_2e0,&local_308);
              if (local_308._size != 0) {
                free(local_308.field_2._str);
              }
              if (local_2e0._0_4_ != 0) {
                free((void *)local_2d8[0]._0_8_);
              }
            }
            uVar9 = &local_298.field_2;
            if (local_298._size != 0) {
              uVar9 = local_298.field_2._str;
            }
            iVar4 = strcmp((char *)uVar9,"keep-alive");
            if (iVar4 == 0) {
              String::String((String *)local_2e0,"Connection");
              String::String(&local_308,"keep-alive");
              HttpMessage::setHeader(&local_260.super_HttpMessage,(String *)local_2e0,&local_308);
              if (local_308._size != 0) {
                free(local_308.field_2._str);
              }
              if (local_2e0._0_4_ != 0) {
                free((void *)local_2d8[0]._0_8_);
              }
            }
            iVar4 = (*(this->super_SocketServer)._vptr_SocketServer[2])(this,&local_180,&local_260);
            if ((char)iVar4 == '\0') {
              pHVar6 = &local_180;
              (*(this->super_SocketServer)._vptr_SocketServer[1])(this,pHVar6,&local_260);
              iVar4 = (int)pHVar6;
              __buf = extraout_RDX;
              if (*(int *)(local_260.super_HttpMessage._body._a + -0x10) == 0) {
                iVar4 = 0x1431d4;
                HttpMessage::put(&local_260.super_HttpMessage,"");
                __buf = extraout_RDX_00;
              }
              if (local_260._code == 0x195) {
                pSVar7 = (String *)local_2e0;
                String::String(pSVar7,"Allow");
                HttpMessage::setHeader(&local_260.super_HttpMessage,pSVar7,local_1d8);
                iVar4 = (int)pSVar7;
                __buf = extraout_RDX_01;
                if (local_2e0._0_4_ != 0) {
                  free((void *)local_2d8[0]._0_8_);
                  __buf = extraout_RDX_02;
                }
              }
              if (local_260.super_HttpMessage._fileBody != true) {
                HttpMessage::write(&local_260.super_HttpMessage,iVar4,__buf,in_RCX);
                goto LAB_0012097f;
              }
              HttpMessage::text(&local_308,&local_260.super_HttpMessage);
              File::File((File *)local_2e0,&local_308);
              if (local_308._size != 0) {
                free(local_308.field_2._str);
              }
              bVar3 = File::isFile((File *)local_2e0);
              local_2f0 = (HttpServer *)CONCAT71(local_2f0._1_7_,bVar3);
              if (bVar3) {
                File::extension(&local_338,(File *)local_2e0);
                String::String(&local_320,"text/plain");
                iVar4 = Map<asl::String,_asl::String>::indexOf
                                  (&this_00->super_Map<asl::String,_asl::String>,&local_338);
                pSVar7 = &(this_00->super_Map<asl::String,_asl::String>).a._a[iVar4].value;
                if (iVar4 < 0) {
                  pSVar7 = &local_320;
                }
                String::String(&local_308,pSVar7);
                if (local_320._size != 0) {
                  free(local_320.field_2._str);
                }
                if (local_338._size != 0) {
                  free(local_338.field_2._str);
                }
                String::String(&local_338,"Date");
                Date::now();
                in_RCX = 0;
                Date::toString(&local_320,(Date *)&local_280,HTTP,false);
                HttpMessage::setHeader(&local_260.super_HttpMessage,&local_338,&local_320);
                if (local_320._size != 0) {
                  free(local_320.field_2._str);
                }
                if (local_338._size != 0) {
                  free(local_338.field_2._str);
                }
                String::String(&local_338,"Content-Type");
                bVar3 = HttpMessage::hasHeader(&local_260.super_HttpMessage,&local_338);
                if (local_338._size != 0) {
                  free(local_338.field_2._str);
                }
                if (!bVar3) {
                  String::String(&local_338,"Content-Type");
                  HttpMessage::setHeader(&local_260.super_HttpMessage,&local_338,&local_308);
                  if (local_338._size != 0) {
                    free(local_338.field_2._str);
                  }
                }
                String::String(&local_338,"Cache-Control");
                bVar3 = HttpMessage::hasHeader(&local_260.super_HttpMessage,&local_338);
                if (local_338._size != 0) {
                  free(local_338.field_2._str);
                }
                if (!bVar3) {
                  String::String(&local_338,"Cache-Control");
                  String::String(&local_320,"max-age=60, public");
                  HttpMessage::setHeader(&local_260.super_HttpMessage,&local_338,&local_320);
                  if (local_320._size != 0) {
                    free(local_320.field_2._str);
                  }
                  if (local_338._size != 0) {
                    free(local_338.field_2._str);
                  }
                }
                String::String(&local_338,"Range");
                bVar3 = HttpMessage::hasHeader(&local_180.super_HttpMessage,&local_338);
                if (local_338._size != 0) {
                  free(local_338.field_2._str);
                }
                if (bVar3) {
                  String::String(&local_320,"Range");
                  HttpMessage::header(&local_338,&local_180.super_HttpMessage,&local_320);
                  if (local_320._size != 0) {
                    free(local_320.field_2._str);
                  }
                  bVar3 = String::startsWith(&local_338,"bytes=");
                  if ((bVar3) && (iVar4 = String::indexOf(&local_338,',',0), iVar4 < 0)) {
                    String::substr(&local_320,&local_338,6,local_338._len);
                    local_280._size = 0;
                    local_280._len = 1;
                    local_280.field_2._0_2_ = 0x2d;
                    String::split((String *)local_2e8,&local_320);
                    if (local_280._size != 0) {
                      free((void *)CONCAT62(local_280.field_2._2_6_,local_280.field_2._0_2_));
                    }
                    if (local_320._size != 0) {
                      free(local_320.field_2._str);
                    }
                    if (*(int *)local_2e8 == 0) {
                      paVar8 = (anon_union_16_2_78e7fdac_for_String_2 *)((long)local_2e8 + 8);
                    }
                    else {
                      paVar8 = (anon_union_16_2_78e7fdac_for_String_2 *)
                               ((anon_union_16_2_78e7fdac_for_String_2 *)((long)local_2e8 + 8))->
                               _str;
                    }
                    iVar4 = myatoi(paVar8->_space);
                    if (((String *)((long)local_2e8 + 0x18))->_size == 0) {
                      paVar8 = &((String *)((long)local_2e8 + 0x18))->field_2;
                    }
                    else {
                      paVar8 = (anon_union_16_2_78e7fdac_for_String_2 *)
                               (((String *)((long)local_2e8 + 0x18))->field_2)._str;
                    }
                    local_264 = myatoi(paVar8->_space);
                    HttpResponse::setCode(&local_260,0xce);
                    String::String(&local_320,"Content-Range");
                    String::String(&local_280,"+");
                    HttpMessage::setHeader(&local_260.super_HttpMessage,&local_320,&local_280);
                    if (local_280._size != 0) {
                      free((void *)CONCAT62(local_280.field_2._2_6_,local_280.field_2._0_2_));
                    }
                    if (local_320._size != 0) {
                      free(local_320.field_2._str);
                    }
                    in_RCX = (size_t)local_264;
                    HttpMessage::putFile(&local_260.super_HttpMessage,local_2d8,iVar4,local_264);
                    Array<asl::String>::~Array((Array<asl::String> *)local_2e8);
                  }
                  if (local_338._size != 0) {
                    free(local_338.field_2._str);
                  }
                }
                else {
                  in_RCX = 0;
                  HttpMessage::putFile(&local_260.super_HttpMessage,local_2d8,0,0);
                }
                String::String(&local_338,"Content-Range");
                bVar3 = HttpMessage::hasHeader(&local_260.super_HttpMessage,&local_338);
                if (bVar3) {
                  String::String(&local_1b0,"Content-Range");
                  HttpMessage::header(&local_198,&local_260.super_HttpMessage,&local_1b0);
                  iVar4 = String::indexOf(&local_198,'*',0);
                  bVar3 = -1 < iVar4;
                  if (local_198._size != 0) {
                    free(local_198.field_2._str);
                  }
                  if (local_1b0._size != 0) {
                    free(local_1b0.field_2._str);
                  }
                }
                else {
                  bVar3 = false;
                }
                if (local_338._size != 0) {
                  free(local_338.field_2._str);
                }
                if (bVar3) {
                  iVar4 = 0x1a0;
                  HttpResponse::setCode(&local_260,0x1a0);
                  HttpMessage::write(&local_260.super_HttpMessage,iVar4,__buf_01,in_RCX);
                }
                if (local_308._size != 0) {
                  free(local_308.field_2._str);
                }
              }
              else {
                HttpResponse::setCode(&local_260,0x194);
                String::String(&local_308,"Content-Type");
                String::String(&local_338,"text/plain");
                HttpMessage::setHeader(&local_260.super_HttpMessage,&local_308,&local_338);
                if (local_338._size != 0) {
                  free(local_338.field_2._str);
                }
                if (local_308._size != 0) {
                  free(local_308.field_2._str);
                }
                iVar4 = 0x1423a6;
                HttpMessage::put(&local_260.super_HttpMessage,"Not found");
                HttpMessage::write(&local_260.super_HttpMessage,iVar4,__buf_00,in_RCX);
              }
              bVar3 = false;
              File::~File((File *)local_2e0);
              if ((char)local_2f0 != '\0') goto LAB_0012097f;
            }
            else {
LAB_0012097f:
              uVar9 = &local_180.super_HttpMessage._proto.field_2;
              if (local_180.super_HttpMessage._proto._size != 0) {
                uVar9 = local_180.super_HttpMessage._proto.field_2._str;
              }
              iVar4 = strcmp((char *)uVar9,"HTTP/1.0");
              if (iVar4 == 0) {
                uVar9 = &local_298.field_2;
                if (local_298._size != 0) {
                  uVar9 = local_298.field_2._str;
                }
                iVar4 = strcmp((char *)uVar9,"keep-alive");
                bVar3 = true;
                if (iVar4 != 0) goto LAB_00120a0c;
              }
              uVar9 = &local_298.field_2;
              if (local_298._size != 0) {
                uVar9 = local_298.field_2._str;
              }
              iVar4 = strcmp((char *)uVar9,"close");
              bVar3 = iVar4 == 0;
              in_RCX = (size_t)bVar3;
            }
LAB_00120a0c:
            HttpMessage::~HttpMessage(&local_260.super_HttpMessage);
          }
          if (local_298._size != 0) {
            free(local_298.field_2._str);
          }
        }
        HttpRequest::~HttpRequest(&local_180);
        if (bVar3) {
          return;
        }
      }
      iVar4 = (*((client->super_SmartObject)._p)->_vptr_SmartObject_[5])();
    } while ((char)iVar4 == '\0');
  }
  return;
}

Assistant:

void HttpServer::serve(Socket client)
{
	double t1 = now();
	while(client.connected() && now() - t1 < 10.0 && !_requestStop)
	{
		if (!client.waitData(5))
			continue;

		HttpRequest request(client);
		if (client.error() || !request.method().ok() || !request.path().ok() || !request.protocol().ok())
			break;

		String hconn = request.header("Connection").toLowerCase();

		if (request.header("Upgrade") == "websocket" && _wsserver)
		{
			if(verbose) printf("handing over to ws\n");
			_wsserver->process(client, request.headers());
			return;
		}

		HttpResponse response(request);

		if (_cors && request.hasHeader("Origin"))
		{
			response.setHeader("Access-Control-Allow-Origin", request.header("Origin"));
			response.setHeader("Access-Control-Allow-Credentials", "true");
		}

		if (hconn == "keep-alive")
			response.setHeader("Connection", "keep-alive");

		if (!handleOptions(request, response))
		{
			serve(request, response);

			if (!response.body())
				response.put("");

			if (response.code() == 405)
				response.setHeader("Allow", _methods);

			if (response.containsFile())
			{
				File file(response.text());
				if (!file.isFile())
				{
					response.setCode(404);
					response.setHeader("Content-Type", "text/plain");
					response.put("Not found");
					response.write();
					continue;
				}

				String mime = _mimetypes.get(file.extension(), "text/plain");
				response.setHeader("Date", Date::now().toString(Date::HTTP));
				if (!response.hasHeader("Content-Type"))
					response.setHeader("Content-Type", mime);
				
				if (!response.hasHeader("Cache-Control"))
					response.setHeader("Cache-Control", "max-age=60, public");
				
				if (request.hasHeader("Range"))
				{
					String range = request.header("Range");
					if (range.startsWith("bytes=") && !range.contains(',')) // no multiple ranges
					{
						Array<String> parts = range.substr(6).split('-');
						int begin = parts[0];
						int end = parts[1];
						response.setCode(206);
						response.setHeader("Content-Range", "+");
						response.putFile(file.path(), begin, end);
					}
				}
				else
					response.putFile(file.path());

				if (response.hasHeader("Content-Range") && response.header("Content-Range").contains('*'))
				{
					response.setCode(416);
					response.write();
				}
			}
			else
				response.write();
		}
		
		if ((request.protocol() == "HTTP/1.0" && hconn != "keep-alive") || hconn == "close")
			break;
	}
}